

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O0

StringRef llvm::dwarf::AttributeValueString(uint16_t Attr,uint Val)

{
  uint Val_local;
  uint16_t Attr_local;
  
  if (Attr == 9) {
    _Val_local = ArrayOrderString(Val);
  }
  else if (Attr == 0x13) {
    _Val_local = LanguageString(Val);
  }
  else if (Attr == 0x17) {
    _Val_local = VisibilityString(Val);
  }
  else if (Attr == 0x20) {
    _Val_local = InlineCodeString(Val);
  }
  else if (Attr == 0x32) {
    _Val_local = AccessibilityString(Val);
  }
  else if (Attr == 0x36) {
    _Val_local = ConventionString(Val);
  }
  else if (Attr == 0x3e) {
    _Val_local = AttributeEncodingString(Val);
  }
  else if (Attr == 0x42) {
    _Val_local = CaseString(Val);
  }
  else if (Attr == 0x4c) {
    _Val_local = VirtualityString(Val);
  }
  else if (Attr == 0x5e) {
    _Val_local = DecimalSignString(Val);
  }
  else if (Attr == 0x65) {
    _Val_local = EndianityString(Val);
  }
  else if (Attr == 0x8b) {
    _Val_local = DefaultedMemberString(Val);
  }
  else if (Attr == 0x3fe6) {
    _Val_local = LanguageString(Val);
  }
  else {
    memset(&Val_local,0,0x10);
    StringRef::StringRef((StringRef *)&Val_local);
  }
  return _Val_local;
}

Assistant:

StringRef llvm::dwarf::AttributeValueString(uint16_t Attr, unsigned Val) {
  switch (Attr) {
  case DW_AT_accessibility:
    return AccessibilityString(Val);
  case DW_AT_virtuality:
    return VirtualityString(Val);
  case DW_AT_language:
    return LanguageString(Val);
  case DW_AT_encoding:
    return AttributeEncodingString(Val);
  case DW_AT_decimal_sign:
    return DecimalSignString(Val);
  case DW_AT_endianity:
    return EndianityString(Val);
  case DW_AT_visibility:
    return VisibilityString(Val);
  case DW_AT_identifier_case:
    return CaseString(Val);
  case DW_AT_calling_convention:
    return ConventionString(Val);
  case DW_AT_inline:
    return InlineCodeString(Val);
  case DW_AT_ordering:
    return ArrayOrderString(Val);
  case DW_AT_APPLE_runtime_class:
    return LanguageString(Val);
  case DW_AT_defaulted:
    return DefaultedMemberString(Val);
  }

  return StringRef();
}